

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printlanguage.cc
# Opt level: O2

void __thiscall PrintLanguage::recurse(PrintLanguage *this)

{
  int iVar1;
  uint4 uVar2;
  pointer pNVar3;
  Varnode *vn;
  PcodeOp *op;
  TypeOp *pTVar4;
  int iVar5;
  
  iVar1 = this->pending;
  uVar2 = this->mods;
  while( true ) {
    pNVar3 = (this->nodepend).
             super__Vector_base<PrintLanguage::NodePending,_std::allocator<PrintLanguage::NodePending>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    iVar5 = (int)(((long)pNVar3 -
                  (long)(this->nodepend).
                        super__Vector_base<PrintLanguage::NodePending,_std::allocator<PrintLanguage::NodePending>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x18);
    this->pending = iVar5;
    if (iVar5 <= iVar1) break;
    vn = pNVar3[-1].vn;
    op = pNVar3[-1].op;
    this->mods = pNVar3[-1].vnmod;
    (this->nodepend).
    super__Vector_base<PrintLanguage::NodePending,_std::allocator<PrintLanguage::NodePending>_>.
    _M_impl.super__Vector_impl_data._M_finish = pNVar3 + -1;
    this->pending = iVar5 + -1;
    if ((vn->flags & 0x40) == 0) {
      pushVnExplicit(this,vn,op);
    }
    else {
      pTVar4 = vn->def->opcode;
      (*pTVar4->_vptr_TypeOp[9])(pTVar4,this);
    }
  }
  this->mods = uVar2;
  return;
}

Assistant:

void PrintLanguage::recurse(void)

{
  uint4 modsave = mods;
  int4 final = pending;		// Already claimed
  pending = nodepend.size();	// Lay claim to the rest
  while(final < pending) {
    const Varnode *vn = nodepend.back().vn;
    const PcodeOp *op = nodepend.back().op;
    mods = nodepend.back().vnmod;
    nodepend.pop_back();
    pending -= 1;
    if (vn->isImplied())
      vn->getDef()->push(this);
    else
      pushVnExplicit(vn,op);
    pending = nodepend.size();
  }
  mods = modsave;
}